

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdICHull.cpp
# Opt level: O3

ICHUllError __thiscall HACD::ICHUll::DoubleTriangle(ICHUll *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  CircularListElement<HACD::TMMVertex> *v2;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  CircularListElement<HACD::TMMTriangle> *fold;
  CircularListElement<HACD::TMMVertex> *pCVar8;
  CircularListElement<HACD::TMMVertex> *v0;
  CircularListElement<HACD::TMMVertex> *pCVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  undefined1 auVar35 [16];
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 in_XMM21 [16];
  TMMVertex local_68;
  
  this->m_isFlat = false;
  pCVar8 = (this->m_mesh).m_vertices.m_head;
  pCVar9 = pCVar8->m_next;
  dVar34 = (pCVar9->m_data).m_pos.m_data[1];
  v0 = pCVar8;
  dVar36 = (pCVar9->m_data).m_pos.m_data[2];
  dVar21 = (pCVar8->m_data).m_pos.m_data[2];
  while( true ) {
    dVar3 = dVar36;
    dVar1 = (v0->m_data).m_pos.m_data[1];
    v2 = pCVar9->m_next;
    dVar4 = dVar3 - dVar21;
    dVar36 = (v2->m_data).m_pos.m_data[2];
    dVar5 = dVar34 - dVar1;
    dVar34 = (v2->m_data).m_pos.m_data[1];
    dVar21 = dVar36 - dVar21;
    dVar1 = dVar34 - dVar1;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = dVar5;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = dVar21;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar1 * dVar4;
    auVar27 = vfmsub231sd_fma(auVar11,auVar31,auVar27);
    if ((auVar27._0_8_ != 0.0) || (NAN(auVar27._0_8_))) break;
    dVar2 = (v0->m_data).m_pos.m_data[0];
    dVar6 = (v2->m_data).m_pos.m_data[0] - dVar2;
    dVar2 = (pCVar9->m_data).m_pos.m_data[0] - dVar2;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar4;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar2 * dVar21;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = dVar6;
    auVar27 = vfmsub213sd_fma(auVar12,auVar14,auVar13);
    if ((auVar27._0_8_ != 0.0) || (NAN(auVar27._0_8_))) break;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = dVar6 * dVar5;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar1;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = dVar2;
    auVar27 = vfmsub213sd_fma(auVar16,auVar37,auVar15);
    if ((auVar27._0_8_ != 0.0) || (NAN(auVar27._0_8_))) break;
    bVar10 = pCVar9 == pCVar8;
    v0 = pCVar9;
    pCVar9 = v2;
    dVar21 = dVar3;
    if (bVar10) {
      return ICHUllErrorCoplanarPoints;
    }
  }
  (v2->m_data).m_tag = true;
  (pCVar9->m_data).m_tag = true;
  (v0->m_data).m_tag = true;
  fold = MakeFace(this,v0,pCVar9,v2,(CircularListElement<HACD::TMMTriangle> *)0x0);
  MakeFace(this,v2,pCVar9,v0,fold);
  pCVar8 = v2->m_next;
  (this->m_mesh).m_vertices.m_head = pCVar8;
  dVar21 = (v0->m_data).m_pos.m_data[0];
  dVar34 = (pCVar8->m_data).m_pos.m_data[0];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar34;
  dVar36 = (pCVar9->m_data).m_pos.m_data[0];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar36;
  dVar1 = (v2->m_data).m_pos.m_data[0];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar1;
  dVar3 = (pCVar8->m_data).m_pos.m_data[1];
  auVar27 = *(undefined1 (*) [16])((v0->m_data).m_pos.m_data + 1);
  auVar31 = *(undefined1 (*) [16])((pCVar9->m_data).m_pos.m_data + 1);
  dVar4 = (pCVar8->m_data).m_pos.m_data[2];
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar4;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = (pCVar9->m_data).m_pos.m_data[2];
  dVar5 = (v2->m_data).m_pos.m_data[1];
  dVar2 = (v0->m_data).m_pos.m_data[2];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar2;
  auVar11 = vsubsd_avx512f(auVar28,auVar29);
  dVar6 = (v2->m_data).m_pos.m_data[2];
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar6;
  dVar19 = auVar27._0_8_;
  auVar12 = vsubsd_avx512f(auVar35,auVar42);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar5 - dVar3;
  auVar13 = vmulsd_avx512f(auVar38,auVar12);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar6 - dVar4;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = auVar31._0_8_ - dVar3;
  auVar13 = vfmsub231sd_avx512f(auVar13,auVar54,auVar43);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = (dVar6 - dVar4) * (dVar36 - dVar34);
  auVar12 = vfmsub231sd_avx512f(auVar44,auVar11,auVar12);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar21 - dVar34;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = (dVar19 - dVar3) * auVar12._0_8_;
  auVar12 = vfmadd231sd_avx512f(auVar45,auVar39,auVar13);
  auVar11 = vmulsd_avx512f(auVar11,auVar54);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar36 - dVar34;
  auVar11 = vfmsub231sd_fma(auVar11,auVar48,auVar38);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar2 - dVar4;
  auVar11 = vfmadd213sd_fma(auVar11,auVar52,auVar12);
  auVar7._8_8_ = 0x7fffffffffffffff;
  auVar7._0_8_ = 0x7fffffffffffffff;
  auVar11 = vandpd_avx512vl(auVar11,auVar7);
  if (1e-09 <= auVar11._0_8_) {
    return ICHUllErrorOK;
  }
  auVar40._8_8_ = 0x7fffffffffffffff;
  auVar40._0_8_ = 0x7fffffffffffffff;
  pCVar9 = pCVar8;
  do {
    pCVar9 = pCVar9->m_next;
    if ((pCVar9->m_data).m_tag == true) {
      dVar34 = 0.0;
      pCVar8 = v0;
      auVar11 = ZEXT816(0);
      do {
        auVar33._0_8_ = auVar11._0_8_ + (pCVar8->m_data).m_pos.m_data[0];
        auVar33._8_8_ = auVar11._8_8_ + (pCVar8->m_data).m_pos.m_data[1];
        dVar34 = dVar34 + (pCVar8->m_data).m_pos.m_data[2];
        pCVar8 = pCVar8->m_next;
        auVar11 = auVar33;
      } while (pCVar8 != v0);
      auVar13 = vcvtusi2sd_avx512f(in_XMM21,(this->m_mesh).m_vertices.m_size);
      auVar17._8_8_ = dVar21;
      auVar17._0_8_ = dVar21;
      auVar12 = vunpcklpd_avx(auVar30,auVar28);
      auVar11 = vsubpd_avx(auVar31,auVar27);
      auVar27 = vunpckhpd_avx(auVar27,auVar17);
      auVar31 = vsubpd_avx(auVar12,auVar27);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = dVar36 - dVar21;
      auVar27 = vshufpd_avx(auVar11,auVar23,1);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = dVar5 - dVar19;
      auVar12 = vunpcklpd_avx(auVar25,auVar31);
      auVar18._0_8_ = auVar12._0_8_ * auVar27._0_8_;
      auVar18._8_8_ = auVar12._8_8_ * auVar27._8_8_;
      auVar27 = vshufpd_avx(auVar31,auVar31,1);
      auVar31 = vfmsub231pd_fma(auVar18,auVar11,auVar31);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = auVar27._0_8_ * auVar11._0_8_;
      auVar12 = vfmsub231sd_fma(auVar20,auVar23,auVar25);
      local_68.m_pos.m_data[2] = auVar12._0_8_;
      dVar36 = auVar13._0_8_;
      auVar41._8_8_ = dVar36;
      auVar41._0_8_ = dVar36;
      auVar27 = vdivpd_avx(auVar33,auVar41);
      auVar24._0_8_ = auVar31._0_8_ * auVar31._0_8_;
      auVar24._8_8_ = auVar31._8_8_ * auVar31._8_8_;
      *(undefined1 (*) [16])(this->m_normal).m_data = auVar31;
      (this->m_normal).m_data[2] = local_68.m_pos.m_data[2];
      auVar11 = vshufpd_avx(auVar24,auVar24,1);
      auVar11 = vfmadd231sd_fma(auVar11,auVar31,auVar31);
      auVar11 = vfmadd231sd_fma(auVar11,auVar12,auVar12);
      auVar11 = vsqrtsd_avx(auVar11,auVar11);
      dVar21 = auVar11._0_8_;
      if ((dVar21 != 0.0) || (NAN(dVar21))) {
        auVar26._8_8_ = dVar21;
        auVar26._0_8_ = dVar21;
        local_68.m_pos.m_data[2] = local_68.m_pos.m_data[2] / dVar21;
        auVar31 = vdivpd_avx(auVar31,auVar26);
        *(undefined1 (*) [16])(this->m_normal).m_data = auVar31;
        (this->m_normal).m_data[2] = local_68.m_pos.m_data[2];
      }
      local_68.m_pos.m_data[2] = dVar34 / dVar36 + local_68.m_pos.m_data[2];
      (this->m_mesh).m_vertices.m_head = v2;
      local_68.m_pos.m_data[1] = auVar27._8_8_ + auVar31._8_8_;
      local_68.m_pos.m_data[0] = auVar27._0_8_ + auVar31._0_8_;
      bVar10 = AddPoints(this,&local_68.m_pos,1);
      if (bVar10) {
        (((this->m_mesh).m_vertices.m_head)->m_data).m_name = 0x7fffffffffffffff;
      }
      this->m_isFlat = true;
      return ICHUllErrorOK;
    }
    dVar34 = (pCVar9->m_data).m_pos.m_data[1];
    auVar49._8_8_ = 0;
    auVar49._0_8_ = dVar34;
    dVar3 = (pCVar9->m_data).m_pos.m_data[2];
    auVar55._8_8_ = 0;
    auVar55._0_8_ = dVar3;
    dVar4 = (pCVar9->m_data).m_pos.m_data[0];
    auVar46._8_8_ = 0;
    auVar46._0_8_ = dVar4;
    auVar11 = vsubsd_avx512f(auVar31,auVar49);
    auVar12 = vsubsd_avx512f(auVar35,auVar55);
    auVar13 = vsubsd_avx512f(auVar32,auVar55);
    auVar14 = vsubsd_avx512f(auVar22,auVar46);
    auVar50._8_8_ = 0;
    auVar50._0_8_ = dVar5 - dVar34;
    auVar15 = vmulsd_avx512f(auVar50,auVar12);
    auVar56._8_8_ = 0;
    auVar56._0_8_ = dVar6 - dVar3;
    auVar15 = vfmsub231sd_avx512f(auVar15,auVar11,auVar56);
    auVar16 = vmulsd_avx512f(auVar56,auVar14);
    auVar47._8_8_ = 0;
    auVar47._0_8_ = dVar1 - dVar4;
    auVar12 = vfmsub231sd_avx512f(auVar16,auVar47,auVar12);
    auVar11 = vmulsd_avx512f(auVar47,auVar11);
    auVar11 = vfmsub231sd_avx512f(auVar11,auVar14,auVar50);
    auVar51._8_8_ = 0;
    auVar51._0_8_ = dVar21 - dVar4;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = (dVar19 - dVar34) * auVar12._0_8_;
    auVar12 = vfmadd231sd_avx512f(auVar53,auVar51,auVar15);
    auVar11 = vfmadd213sd_avx512f(auVar11,auVar13,auVar12);
    auVar11 = vandpd_avx(auVar11,auVar40);
  } while (auVar11._0_8_ < 1e-09);
  if (pCVar9 != pCVar8) {
    TMMVertex::TMMVertex(&local_68);
    local_68.m_name = (pCVar9->m_data).m_name;
    local_68.m_pos.m_data._0_16_ = *(undefined1 (*) [16])(pCVar9->m_data).m_pos.m_data;
    local_68.m_pos.m_data[2] = (pCVar9->m_data).m_pos.m_data[2];
    pCVar8 = (this->m_mesh).m_vertices.m_head;
    (pCVar9->m_data).m_name = (pCVar8->m_data).m_name;
    (pCVar9->m_data).m_pos.m_data[0] = (pCVar8->m_data).m_pos.m_data[0];
    (pCVar9->m_data).m_pos.m_data[1] = (pCVar8->m_data).m_pos.m_data[1];
    (pCVar9->m_data).m_pos.m_data[2] = (pCVar8->m_data).m_pos.m_data[2];
    (pCVar8->m_data).m_name = local_68.m_name;
    dVar21 = (double)vmovlps_avx((undefined1  [16])local_68.m_pos.m_data._0_16_);
    (pCVar8->m_data).m_pos.m_data[0] = dVar21;
    (pCVar8->m_data).m_pos.m_data[1] = local_68.m_pos.m_data[1];
    (pCVar8->m_data).m_pos.m_data[2] = local_68.m_pos.m_data[2];
    TMMVertex::~TMMVertex(&local_68);
  }
  return ICHUllErrorOK;
}

Assistant:

ICHUllError ICHUll::DoubleTriangle()
	{
        // find three non colinear points
		m_isFlat = false;
        CircularList<TMMVertex> & vertices = m_mesh.GetVertices();
        CircularListElement<TMMVertex> * v0 = vertices.GetHead();
        while( Colinear(v0->GetData().m_pos, 
                        v0->GetNext()->GetData().m_pos, 
                        v0->GetNext()->GetNext()->GetData().m_pos))
        {
            if ( (v0 = v0->GetNext()) == vertices.GetHead())
            {
                return ICHUllErrorCoplanarPoints;
            }
        }
        CircularListElement<TMMVertex> * v1 = v0->GetNext();
        CircularListElement<TMMVertex> * v2 = v1->GetNext();
        // mark points as processed
        v0->GetData().m_tag = v1->GetData().m_tag = v2->GetData().m_tag = true;
        
        // create two triangles
        CircularListElement<TMMTriangle> * f0 = MakeFace(v0, v1, v2, 0);
        MakeFace(v2, v1, v0, f0);

        // find a fourth non-coplanar point to form tetrahedron
        CircularListElement<TMMVertex> * v3 = v2->GetNext();
        vertices.GetHead() = v3;

		double vol = Volume(v0->GetData().m_pos, v1->GetData().m_pos, v2->GetData().m_pos, v3->GetData().m_pos);
		while (fabs(vol) < sc_eps && !v3->GetNext()->GetData().m_tag)
		{
			v3 = v3->GetNext();
			vol = Volume(v0->GetData().m_pos, v1->GetData().m_pos, v2->GetData().m_pos, v3->GetData().m_pos);
		}			
		if (fabs(vol) < sc_eps)
		{
			// compute the barycenter
			Vec3<Real> bary(0.0,0.0,0.0);
			CircularListElement<TMMVertex> * vBary = v0;
			do
			{
				bary += vBary->GetData().m_pos;
			}
			while ( (vBary = vBary->GetNext()) != v0);
			bary /= static_cast<Real>(vertices.GetSize());

			// Compute the normal to the plane
            Vec3<Real> p0 = v0->GetData().m_pos;
            Vec3<Real> p1 = v1->GetData().m_pos;            
            Vec3<Real> p2 = v2->GetData().m_pos;			
            m_normal = (p1-p0) ^ (p2-p0);
            m_normal.Normalize();
			// add dummy vertex placed at (bary + normal)
			vertices.GetHead() = v2;
			Vec3<Real> newPt = bary + m_normal;
			AddPoint(newPt, sc_dummyIndex); 
			m_isFlat = true;
            v3 = v2->GetNext();
			return ICHUllErrorOK;
		}
		else if (v3 != vertices.GetHead())
		{
			TMMVertex temp;
			temp.m_name = v3->GetData().m_name;
			temp.m_pos = v3->GetData().m_pos;
			v3->GetData().m_name = vertices.GetHead()->GetData().m_name;
			v3->GetData().m_pos = vertices.GetHead()->GetData().m_pos;
			vertices.GetHead()->GetData().m_name = temp.m_name;
			vertices.GetHead()->GetData().m_pos = temp.m_pos;
		}
		return ICHUllErrorOK;
	}